

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O3

void __thiscall Kernel::Clause::Clause(Clause *this,Literal **lits,uint length,Inference *inf)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  Inference local_48;
  
  local_48._0_8_ = *(undefined8 *)inf;
  local_48._8_4_ = *(undefined4 *)&inf->field_0x8;
  local_48._age = inf->_age;
  local_48._splits = inf->_splits;
  local_48._ptr1 = inf->_ptr1;
  local_48._ptr2 = inf->_ptr2;
  local_48.th_ancestors = inf->th_ancestors;
  local_48.all_ancestors = inf->all_ancestors;
  Unit::Unit(&this->super_Unit,CLAUSE,&local_48);
  uVar2 = *(ulong *)&this->field_0x38 & 0xfff00000f0000000;
  *(ulong *)&this->field_0x38 = uVar2 + (length & 0xfffff) + 0x6300000;
  this->_auxTimestamp = 0;
  this->_weight = 0;
  this->_weightForClauseSelection = 0;
  this->_refCnt = 0;
  this->_reductionTimestamp = 0;
  *(undefined8 *)&this->_reductionTimestamp = 0;
  *(undefined8 *)((long)&this->_literalPositions + 4) = 0;
  uVar1 = *(ulong *)&(this->super_Unit)._inference;
  if (((uint)uVar1 & 0x1c) == 0x14) {
    *(ulong *)&this->field_0x38 = uVar2 | length & 0xfffff | 0x6b00000;
    *(ulong *)&(this->super_Unit)._inference = uVar1 & 0xffffffffffffffe3;
  }
  if (length != 0) {
    lVar3 = 0;
    do {
      this->_literals[(int)lVar3] = lits[lVar3];
      lVar3 = lVar3 + 1;
    } while (length != (uint)lVar3);
  }
  Unit::doUnitTracing(&this->super_Unit);
  return;
}

Assistant:

Clause::Clause(Literal* const* lits, unsigned length, Inference inf)
  : Unit(Unit::CLAUSE, std::move(inf)),
    _length(length),
    _color(COLOR_INVALID),
    _extensionality(false),
    _extensionalityTag(false),
    _component(false),
    _store(NONE),
    _numSelected(0),
    _weight(0),
    _weightForClauseSelection(0),
    _refCnt(0),
    _reductionTimestamp(0),
    _literalPositions(0),
    _numActiveSplits(0),
    _auxTimestamp(0)
{
  // MS: TODO: not sure if this belongs here and whether EXTENSIONALITY_AXIOM input types ever appear anywhere (as a vampire-extension TPTP formula role)
  if(inference().inputType() == UnitInputType::EXTENSIONALITY_AXIOM){
    //cout << "Setting extensionality" << endl;
    _extensionalityTag = true;
    inference().setInputType(UnitInputType::AXIOM);
  }

  for(unsigned i = 0; i < length; i++) {
    (*this)[i] = lits[i];
  }

  doUnitTracing();
}